

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.h
# Opt level: O0

DataLocationUsage * __thiscall
kj::Vector<capnp::compiler::NodeTranslator::StructLayout::Group::DataLocationUsage>::
add<unsigned_int&>(Vector<capnp::compiler::NodeTranslator::StructLayout::Group::DataLocationUsage>
                   *this,uint *params)

{
  bool bVar1;
  uint *params_00;
  DataLocationUsage *pDVar2;
  uint *params_local;
  Vector<capnp::compiler::NodeTranslator::StructLayout::Group::DataLocationUsage> *this_local;
  
  bVar1 = ArrayBuilder<capnp::compiler::NodeTranslator::StructLayout::Group::DataLocationUsage>::
          isFull(&this->builder);
  if (bVar1) {
    grow(this,0);
  }
  params_00 = fwd<unsigned_int&>(params);
  pDVar2 = ArrayBuilder<capnp::compiler::NodeTranslator::StructLayout::Group::DataLocationUsage>::
           add<unsigned_int&>(&this->builder,params_00);
  return pDVar2;
}

Assistant:

inline T& add(Params&&... params) {
    if (builder.isFull()) grow();
    return builder.add(kj::fwd<Params>(params)...);
  }